

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void uv__stream_flush_write_queue(uv_stream_t *stream,int error)

{
  uv__queue *puVar1;
  uv__queue *puVar2;
  
  puVar2 = (stream->write_queue).next;
  if (puVar2 != &stream->write_queue) {
    do {
      puVar1 = puVar2->next;
      puVar2->prev->next = puVar1;
      puVar1->prev = puVar2->prev;
      *(int *)((long)&puVar2[2].next + 4) = error;
      puVar2->next = &stream->write_completed_queue;
      puVar1 = (stream->write_completed_queue).prev;
      puVar2->prev = puVar1;
      puVar1->next = puVar2;
      (stream->write_completed_queue).prev = puVar2;
      puVar2 = (stream->write_queue).next;
    } while (puVar2 != &stream->write_queue);
  }
  return;
}

Assistant:

void uv__stream_flush_write_queue(uv_stream_t* stream, int error) {
  uv_write_t* req;
  struct uv__queue* q;
  while (!uv__queue_empty(&stream->write_queue)) {
    q = uv__queue_head(&stream->write_queue);
    uv__queue_remove(q);

    req = uv__queue_data(q, uv_write_t, queue);
    req->error = error;

    uv__queue_insert_tail(&stream->write_completed_queue, &req->queue);
  }
}